

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  xpath_ast_node *pxVar1;
  xpath_node_set_raw *pxVar2;
  xpath_node_set_raw *extraout_RAX;
  xpath_node_set_raw *extraout_RAX_00;
  xpath_node_set_raw *extraout_RAX_01;
  xpath_node_set_raw *extraout_RAX_02;
  xpath_node_set_raw *extraout_RAX_03;
  long lVar3;
  xpath_node *pxVar4;
  bool bVar5;
  xpath_node_set_raw s;
  xpath_node_set_raw local_50;
  
  pxVar1 = this->_right;
  if (pxVar1 == (xpath_ast_node *)0x0) {
    bVar5 = eval == nodeset_eval_any;
  }
  else if (pxVar1->_next == (xpath_ast_node *)0x0) {
    bVar5 = pxVar1->_test == '\x03';
  }
  else {
    bVar5 = false;
  }
  __return_storage_ptr__->_eos = (xpath_node *)0x0;
  __return_storage_ptr__->_begin = (xpath_node *)0x0;
  __return_storage_ptr__->_end = (xpath_node *)0x0;
  __return_storage_ptr__->_type = type_sorted_reverse;
  if (this->_left == (xpath_ast_node *)0x0) {
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
              (this,__return_storage_ptr__,c,stack->result,bVar5);
    pxVar2 = extraout_RAX_01;
    if (this->_right != (xpath_ast_node *)0x0) {
      apply_predicates(this,__return_storage_ptr__,0,stack,eval);
      pxVar2 = extraout_RAX_02;
    }
  }
  else {
    pxVar2 = eval_node_set(&local_50,this->_left,c,stack,nodeset_eval_all);
    pxVar4 = local_50._begin;
    if (local_50._begin != local_50._end) {
      do {
        lVar3 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar3 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                  (this,__return_storage_ptr__,pxVar4,stack->result,bVar5);
        pxVar2 = extraout_RAX;
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar3 >> 4,stack,eval);
          pxVar2 = extraout_RAX_00;
        }
        pxVar4 = pxVar4 + 1;
      } while (pxVar4 != local_50._end);
    }
  }
  if (__return_storage_ptr__->_type == type_unsorted) {
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    pxVar2 = extraout_RAX_03;
  }
  return pxVar2;
}

Assistant:

xpath_node_set_raw step_do(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_reverse = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_preceding || axis == axis_preceding_sibling);
			const xpath_node_set::type_t axis_type = axis_reverse ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

			bool once =
				(axis == axis_attribute && _test == nodetest_name) ||
				(!_right && eval_once(axis_type, eval)) ||
			    // coverity[mixed_enums]
				(_right && !_right->_next && _right->_test == predicate_constant_one);

			xpath_node_set_raw ns;
			ns.set_type(axis_type);

			if (_left)
			{
				xpath_node_set_raw s = _left->eval_node_set(c, stack, nodeset_eval_all);

				// self axis preserves the original order
				if (axis == axis_self) ns.set_type(s.type());

				for (const xpath_node* it = s.begin(); it != s.end(); ++it)
				{
					size_t size = ns.size();

					// in general, all axes generate elements in a particular order, but there is no order guarantee if axis is applied to two nodes
					if (axis != axis_self && size != 0) ns.set_type(xpath_node_set::type_unsorted);

					step_fill(ns, *it, stack.result, once, v);
					if (_right) apply_predicates(ns, size, stack, eval);
				}
			}
			else
			{
				step_fill(ns, c.n, stack.result, once, v);
				if (_right) apply_predicates(ns, 0, stack, eval);
			}

			// child, attribute and self axes always generate unique set of nodes
			// for other axis, if the set stayed sorted, it stayed unique because the traversal algorithms do not visit the same node twice
			if (axis != axis_child && axis != axis_attribute && axis != axis_self && ns.type() == xpath_node_set::type_unsorted)
				ns.remove_duplicates(stack.temp);

			return ns;
		}